

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-coordinator.c
# Opt level: O2

void emergency(int sig)

{
  fputc(10,_stderr);
  siglongjmp((__jmp_buf_tag *)ctrlc_capture,1);
}

Assistant:

void emergency(int sig)
{
  fprintf(stderr, "\n");
#if HAVE_SIGLONGJMP
  siglongjmp(ctrlc_capture, 1);
#elif HAVE_LONGJMP
  longjmp(ctrlc_capture, 1);
#else
#ifdef HAVE_SSM
  /* SSM終了処理 */
  if (!option(OPTION_WITHOUT_SSM))
    end_ypspurSSM();
#endif  // HAVE_SSM
  if (!(option(OPTION_WITHOUT_DEVICE)))
  {
    serial_close();
  }

  exit(0);
#endif  // HAVE_SIGLONGJMP
}